

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O0

int CVBBDDQJac(CVBBDPrecData pdata,sunrealtype t,N_Vector y,N_Vector gy,N_Vector ytemp,
              N_Vector gtemp)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  sunrealtype *psVar11;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  int retval;
  sunrealtype *cns_data;
  sunrealtype *col_j;
  sunrealtype *ytemp_data;
  sunrealtype *gtemp_data;
  sunrealtype *gy_data;
  sunrealtype *ewt_data;
  sunrealtype *y_data;
  sunindextype i2;
  sunindextype i1;
  sunindextype ngroups;
  sunindextype width;
  sunindextype j;
  sunindextype i;
  sunindextype group;
  sunrealtype conj;
  sunrealtype yj;
  sunrealtype inc_inv;
  sunrealtype inc;
  sunrealtype minInc;
  sunrealtype gnorm;
  CVodeMem cv_mem;
  long local_118;
  long local_110;
  double local_108;
  double local_100;
  long local_f8;
  double local_f0;
  long local_e0;
  long local_88;
  long local_80;
  long local_78;
  double local_58;
  int local_4;
  
  local_e0 = 0;
  lVar3 = in_RDI[0x13];
  N_VScale(0x3ff0000000000000,in_RSI,in_RCX);
  if ((in_RDI[6] == 0) ||
     (local_4 = (*(code *)in_RDI[6])(in_XMM0_Qa,in_RDI[0xf],in_RSI,*(undefined8 *)(lVar3 + 0x18)),
     local_4 == 0)) {
    local_4 = (*(code *)in_RDI[5])
                        (in_XMM0_Qa,in_RDI[0xf],in_RCX,in_RDX,*(undefined8 *)(lVar3 + 0x18));
    in_RDI[0x12] = in_RDI[0x12] + 1;
    if (local_4 == 0) {
      lVar5 = N_VGetArrayPointer(in_RSI);
      lVar6 = N_VGetArrayPointer(in_RDX);
      lVar7 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 200));
      lVar8 = N_VGetArrayPointer(in_RCX);
      lVar9 = N_VGetArrayPointer(in_R8);
      if (*(int *)(lVar3 + 0x58) != 0) {
        local_e0 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x108));
      }
      local_f0 = (double)N_VWrmsNorm(in_RDX,*(undefined8 *)(lVar3 + 200));
      if ((local_f0 != 0.0) || (NAN(local_f0))) {
        local_f0 = ABS(*(double *)(lVar3 + 0x140)) * 1000.0 * *(double *)(lVar3 + 8) *
                   (double)in_RDI[0xf] * local_f0;
      }
      else {
        local_f0 = 1.0;
      }
      lVar10 = in_RDI[1] + *in_RDI + 1;
      local_f8 = lVar10;
      if (in_RDI[0xf] <= lVar10) {
        local_f8 = in_RDI[0xf];
      }
      for (local_78 = 1; local_78 <= local_f8; local_78 = local_78 + 1) {
        for (local_88 = local_78 + -1; local_88 < in_RDI[0xf]; local_88 = lVar10 + local_88) {
          if ((double)in_RDI[4] * ABS(*(double *)(lVar5 + local_88 * 8)) <=
              local_f0 / *(double *)(lVar7 + local_88 * 8)) {
            local_100 = local_f0 / *(double *)(lVar7 + local_88 * 8);
          }
          else {
            local_100 = (double)in_RDI[4] * ABS(*(double *)(lVar5 + local_88 * 8));
          }
          local_58 = local_100;
          dVar1 = *(double *)(lVar5 + local_88 * 8);
          if (*(int *)(lVar3 + 0x58) != 0) {
            dVar2 = *(double *)(local_e0 + local_88 * 8);
            if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
              if ((ABS(dVar2) == 2.0) &&
                 ((!NAN(ABS(dVar2)) && ((dVar1 + local_100) * dVar2 <= 0.0)))) {
                local_58 = -local_100;
              }
            }
            else if ((dVar1 + local_100) * dVar2 < 0.0) {
              local_58 = -local_100;
            }
          }
          *(double *)(lVar8 + local_88 * 8) = local_58 + *(double *)(lVar8 + local_88 * 8);
        }
        iVar4 = (*(code *)in_RDI[5])
                          (in_XMM0_Qa,in_RDI[0xf],in_RCX,in_R8,*(undefined8 *)(lVar3 + 0x18));
        in_RDI[0x12] = in_RDI[0x12] + 1;
        if (iVar4 != 0) {
          return iVar4;
        }
        for (local_88 = local_78 + -1; local_88 < in_RDI[0xf]; local_88 = lVar10 + local_88) {
          dVar1 = *(double *)(lVar5 + local_88 * 8);
          *(undefined8 *)(lVar8 + local_88 * 8) = *(undefined8 *)(lVar5 + local_88 * 8);
          psVar11 = SUNBandMatrix_Column((SUNMatrix)in_RDI[7],local_88);
          if ((double)in_RDI[4] * ABS(*(double *)(lVar5 + local_88 * 8)) <=
              local_f0 / *(double *)(lVar7 + local_88 * 8)) {
            local_108 = local_f0 / *(double *)(lVar7 + local_88 * 8);
          }
          else {
            local_108 = (double)in_RDI[4] * ABS(*(double *)(lVar5 + local_88 * 8));
          }
          local_58 = local_108;
          if (*(int *)(lVar3 + 0x58) != 0) {
            dVar2 = *(double *)(local_e0 + local_88 * 8);
            if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
              if ((ABS(dVar2) == 2.0) &&
                 ((!NAN(ABS(dVar2)) && ((dVar1 + local_108) * dVar2 <= 0.0)))) {
                local_58 = -local_108;
              }
            }
            else if ((dVar1 + local_108) * dVar2 < 0.0) {
              local_58 = -local_108;
            }
          }
          if (local_88 - in_RDI[2] < 0) {
            local_110 = 0;
          }
          else {
            local_110 = local_88 - in_RDI[2];
          }
          if (local_88 + in_RDI[3] < in_RDI[0xf] + -1) {
            local_118 = local_88 + in_RDI[3];
          }
          else {
            local_118 = in_RDI[0xf] + -1;
          }
          for (local_80 = local_110; local_80 <= local_118; local_80 = local_80 + 1) {
            psVar11[local_80 - local_88] =
                 (1.0 / local_58) *
                 (*(double *)(lVar9 + local_80 * 8) - *(double *)(lVar6 + local_80 * 8));
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int CVBBDDQJac(CVBBDPrecData pdata, sunrealtype t, N_Vector y,
                      N_Vector gy, N_Vector ytemp, N_Vector gtemp)
{
  CVodeMem cv_mem;
  sunrealtype gnorm, minInc, inc, inc_inv, yj, conj;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunrealtype *y_data, *ewt_data, *gy_data, *gtemp_data;
  sunrealtype *ytemp_data, *col_j, *cns_data;
  int retval;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  cv_mem = (CVodeMem)pdata->cvode_mem;

  /* Load ytemp with y = predicted solution vector */
  N_VScale(ONE, y, ytemp);

  /* Call cfn and gloc to get base value of g(t,y) */
  if (pdata->cfn != NULL)
  {
    retval = pdata->cfn(pdata->n_local, t, y, cv_mem->cv_user_data);
    if (retval != 0) { return (retval); }
  }

  retval = pdata->gloc(pdata->n_local, t, ytemp, gy, cv_mem->cv_user_data);
  pdata->nge++;
  if (retval != 0) { return (retval); }

  /* Obtain pointers to the data for various vectors */
  y_data     = N_VGetArrayPointer(y);
  gy_data    = N_VGetArrayPointer(gy);
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  ytemp_data = N_VGetArrayPointer(ytemp);
  gtemp_data = N_VGetArrayPointer(gtemp);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Set minimum increment based on uround and norm of g */
  gnorm  = N_VWrmsNorm(gy, cv_mem->cv_ewt);
  minInc = (gnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * pdata->n_local * gnorm)
                           : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width   = pdata->mldq + pdata->mudq + 1;
  ngroups = SUNMIN(width, pdata->n_local);

  /* Loop over groups */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all y_j in group */
    for (j = group - 1; j < pdata->n_local; j += width)
    {
      inc = SUNMAX(pdata->dqrely * SUNRabs(y_data[j]), minInc / ewt_data[j]);
      yj  = y_data[j];

      /* Adjust sign(inc) again if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate g with incremented y */
    retval = pdata->gloc(pdata->n_local, t, ytemp, gtemp, cv_mem->cv_user_data);
    pdata->nge++;
    if (retval != 0) { return (retval); }

    /* Restore ytemp, then form and load difference quotients */
    for (j = group - 1; j < pdata->n_local; j += width)
    {
      yj            = y_data[j];
      ytemp_data[j] = y_data[j];
      col_j         = SUNBandMatrix_Column(pdata->savedJ, j);
      inc = SUNMAX(pdata->dqrely * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - pdata->mukeep);
      i2      = SUNMIN(j + pdata->mlkeep, pdata->n_local - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (gtemp_data[i] - gy_data[i]);
      }
    }
  }

  return (0);
}